

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

uintmax_t ghc::filesystem::hard_link_count(path *p)

{
  int code;
  uintmax_t uVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  error_code local_50;
  string local_40;
  
  local_50._M_value = 0;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  uVar1 = hard_link_count(p,&local_50);
  code = local_50._M_value;
  if (local_50._M_value == 0) {
    return uVar1;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_40,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_50._M_cat;
  filesystem_error::filesystem_error(this,&local_40,p,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE uintmax_t hard_link_count(const path& p)
{
    std::error_code ec;
    auto result = hard_link_count(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}